

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_floor.cpp
# Opt level: O2

bool EV_DoChange(line_t_conflict *line,EChange changetype,int tag)

{
  uint uVar1;
  sector_t_conflict *model;
  bool bVar2;
  sector_t_conflict *this;
  double floordestheight;
  FSectorTagIterator it;
  
  if (tag == 0) {
    it.start = 0;
  }
  else {
    it.start = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
  }
  it.searchtag = tag;
  bVar2 = false;
  while( true ) {
    uVar1 = FSectorTagIterator::Next(&it);
    if ((int)uVar1 < 0) break;
    this = sectors + uVar1;
    bVar2 = true;
    if (changetype == numChangeOnly) {
      floordestheight = sector_t::CenterFloor((sector_t *)this);
      model = sector_t::FindModelFloorSector((sector_t *)this,floordestheight);
      if (model != (sector_t_conflict *)0x0) {
        sector_t::SetTexture((sector_t *)this,0,(FTextureID)model->planes[0].Texture.texnum,true);
        sector_t::TransferSpecial(this,model);
      }
    }
    else if ((changetype == trigChangeOnly) && (line != (line_t_conflict *)0x0)) {
      sector_t::SetTexture
                ((sector_t *)this,0,(FTextureID)line->frontsector->planes[0].Texture.texnum,true);
      sector_t::TransferSpecial(this,line->frontsector);
    }
  }
  return bVar2;
}

Assistant:

bool EV_DoChange (line_t *line, EChange changetype, int tag)
{
	int			secnum;
	bool		rtn;
	sector_t	*sec;
	sector_t	*secm;

	rtn = false;
	// change all sectors with the same tag as the linedef
	FSectorTagIterator it(tag);
	while ((secnum = it.Next()) >= 0)
	{
		sec = &sectors[secnum];
              
		rtn = true;

		// handle trigger or numeric change type
		FTextureID oldpic = sec->GetTexture(sector_t::floor);

		switch(changetype)
		{
		case trigChangeOnly:
			if (line)
			{ // [RH] if no line, no change
				sec->SetTexture(sector_t::floor, line->frontsector->GetTexture(sector_t::floor));
				sec->TransferSpecial(line->frontsector);
			}
			break;
		case numChangeOnly:
			secm = sec->FindModelFloorSector (sec->CenterFloor());
			if (secm)
			{ // if no model, no change
				sec->SetTexture(sector_t::floor, secm->GetTexture(sector_t::floor));
				sec->TransferSpecial(secm);
			}
			break;
		default:
			break;
		}
	}
	return rtn;
}